

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_test.cpp
# Opt level: O1

void __thiscall
bidfx_public_api::tools::DateTest_test_valid_date_to_string_Test::TestBody
          (DateTest_test_valid_date_to_string_Test *this)

{
  bool bVar1;
  Date *pDVar2;
  char *pcVar3;
  AssertionResult gtest_ar;
  AssertHelper local_50;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48 [2];
  long local_38 [2];
  internal local_28 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  
  pDVar2 = (Date *)operator_new(0xc);
  bidfx_public_api::tools::Date::Date(pDVar2,0x7e2,10,10);
  bidfx_public_api::tools::Date::ToString_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            (local_28,"date1->ToString().c_str()","\"20181010\"",(char *)local_48[0].ptr_,"20181010"
            );
  if (local_48[0].ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38) {
    operator_delete(local_48[0].ptr_,local_38[0] + 1);
  }
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_48);
    if (local_20.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_20.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/date_test.cpp"
               ,0x17,pcVar3);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if (local_48[0].ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_48[0].ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_48[0].ptr_ + 8))();
      }
      local_48[0].ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    pDVar2 = (Date *)operator_new(0xc);
    bidfx_public_api::tools::Date::Date(pDVar2,0x7e2,9,5);
    bidfx_public_api::tools::Date::ToString_abi_cxx11_();
    testing::internal::CmpHelperSTREQ
              (local_28,"date2->ToString().c_str()","\"20180905\"",(char *)local_48[0].ptr_,
               "20180905");
    if (local_48[0].ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38) {
      operator_delete(local_48[0].ptr_,local_38[0] + 1);
    }
    if (local_28[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_48);
      if (local_20.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((local_20.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_50,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/date_test.cpp"
                 ,0x1a,pcVar3);
      testing::internal::AssertHelper::operator=(&local_50,(Message *)local_48);
      testing::internal::AssertHelper::~AssertHelper(&local_50);
      if (local_48[0].ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           (local_48[0].ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_48[0].ptr_ + 8))();
        }
        local_48[0].ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  return;
}

Assistant:

TEST(DateTest, test_valid_date_to_string) {
    Date* date1 = new Date(2018, 10, 10);
    ASSERT_STREQ(date1->ToString().c_str(), "20181010");

    Date* date2 = new Date(2018, 9, 5);
    ASSERT_STREQ(date2->ToString().c_str(), "20180905");
}